

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O0

void __thiscall
IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
          (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *this,unsigned_long start,
          unsigned_long stop,intervalVector *overlapping)

{
  bool bVar1;
  const_reference pvVar2;
  reference __x;
  pointer pIVar3;
  interval *interval;
  __normal_iterator<const_Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
  local_30;
  const_iterator i;
  intervalVector *overlapping_local;
  unsigned_long stop_local;
  unsigned_long start_local;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *this_local;
  
  i._M_current = (Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *)overlapping;
  bVar1 = std::
          vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
          ::empty(&this->intervals);
  if ((!bVar1) &&
     (pvVar2 = std::
               vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               ::front(&this->intervals), pvVar2->start <= stop)) {
    local_30._M_current =
         (Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *)
         std::
         vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
         ::begin(&this->intervals);
    while( true ) {
      interval = (interval *)
                 std::
                 vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                 ::end(&this->intervals);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<const_Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
                          *)&interval);
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<const_Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
            ::operator*(&local_30);
      if ((start <= __x->stop) && (__x->start <= stop)) {
        std::
        vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
        ::push_back((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                     *)i._M_current,__x);
      }
      __gnu_cxx::
      __normal_iterator<const_Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
      ::operator++(&local_30);
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->left);
  if ((bVar1) && (start <= this->center)) {
    pIVar3 = std::
             unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ::operator->(&this->left);
    findOverlapping(pIVar3,start,stop,(intervalVector *)i._M_current);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->right);
  if ((bVar1) && (this->center <= stop)) {
    pIVar3 = std::
             unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ::operator->(&this->right);
    findOverlapping(pIVar3,start,stop,(intervalVector *)i._M_current);
  }
  return;
}

Assistant:

void findOverlapping(K start, K stop, intervalVector& overlapping) const {
        if (!intervals.empty() && ! (stop < intervals.front().start)) {
            for (typename intervalVector::const_iterator i = intervals.begin(); i != intervals.end(); ++i) {
                const interval& interval = *i;
                if (interval.stop >= start && interval.start <= stop) {
                    overlapping.push_back(interval);
                }
            }
        }

        if (left && start <= center) {
            left->findOverlapping(start, stop, overlapping);
        }

        if (right && stop >= center) {
            right->findOverlapping(start, stop, overlapping);
        }

    }